

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O2

hrgls_DataBlob __thiscall hrgls::datablob::DataBlob::RawDataBlob(DataBlob *this)

{
  DataBlob_private *pDVar1;
  hrgls_Status hVar2;
  hrgls_DataBlob phVar3;
  
  pDVar1 = this->m_private;
  phVar3 = (hrgls_DataBlob)0x0;
  if (pDVar1 != (DataBlob_private *)0x0) {
    phVar3 = pDVar1->blob;
    hVar2 = 0;
    if (phVar3 == (hrgls_DataBlob)0x0) {
      hVar2 = 0x3ee;
    }
    pDVar1->status = hVar2;
  }
  return phVar3;
}

Assistant:

hrgls_DataBlob const DataBlob::RawDataBlob() const
    {
      hrgls_DataBlob ret = nullptr;
      if (!m_private) {
        return ret;
      }
      if (!m_private->blob) {
        m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
        return ret;
      }
      m_private->status = hrgls_STATUS_OKAY;
      return m_private->blob;
    }